

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

Oop __thiscall
Lodtalk::MethodSemanticAnalysis::visitIdentifierExpression
          (MethodSemanticAnalysis *this,IdentifierExpression *node)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> location;
  bool bVar1;
  uint uVar2;
  Oop symbol;
  undefined8 uVar3;
  element_type *peVar4;
  element_type *peVar5;
  Node *pNVar6;
  undefined1 local_58 [8];
  shared_ptr<Lodtalk::TemporalVariableLookup> temporal;
  VariableLookupPtr variable;
  IdentifierExpression *node_local;
  MethodSemanticAnalysis *this_local;
  
  variable.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)node;
  symbol.field_0 =
       (anon_union_8_4_0eb573b0_for_Oop_0)
       std::__shared_ptr_access<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
       ::operator->((__shared_ptr_access<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)&(this->super_ScopedInterpreter).currentScope);
  AST::IdentifierExpression::getSymbol
            ((IdentifierExpression *)
             variable.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  EvaluationScope::lookSymbolRecursively((EvaluationScope *)&stack0xffffffffffffffd0,symbol);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffd0);
  location = variable.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  if (!bVar1) {
    AST::IdentifierExpression::getIdentifier_abi_cxx11_
              ((IdentifierExpression *)
               variable.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    uVar3 = std::__cxx11::string::c_str();
    AbstractASTVisitor::error
              ((AbstractASTVisitor *)this,(Node *)location._M_pi,"undeclared identifier \'%s\'.",
               uVar3);
  }
  peVar4 = std::
           __shared_ptr_access<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&stack0xffffffffffffffd0);
  uVar2 = (*peVar4->_vptr_VariableLookup[2])();
  if ((uVar2 & 1) != 0) {
    std::static_pointer_cast<Lodtalk::TemporalVariableLookup,Lodtalk::VariableLookup>
              ((shared_ptr<Lodtalk::VariableLookup> *)local_58);
    peVar5 = std::
             __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
    pNVar6 = TemporalVariableLookup::getLocalContext(peVar5);
    if (pNVar6 != this->localContext) {
      peVar5 = std::
               __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_58);
      TemporalVariableLookup::setCapturedInClosure(peVar5,true);
    }
    std::shared_ptr<Lodtalk::TemporalVariableLookup>::~shared_ptr
              ((shared_ptr<Lodtalk::TemporalVariableLookup> *)local_58);
  }
  AST::IdentifierExpression::setVariable
            ((IdentifierExpression *)
             variable.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,(VariableLookupPtr *)&stack0xffffffffffffffd0);
  Oop::Oop((Oop *)&this_local);
  std::shared_ptr<Lodtalk::VariableLookup>::~shared_ptr
            ((shared_ptr<Lodtalk::VariableLookup> *)&stack0xffffffffffffffd0);
  return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
}

Assistant:

Oop MethodSemanticAnalysis::visitIdentifierExpression(IdentifierExpression *node)
{
    // Find the variable
    auto variable = currentScope->lookSymbolRecursively(node->getSymbol());
    if(!variable)
        error(node, "undeclared identifier '%s'.", node->getIdentifier().c_str());

    // Check the variable context, for marking the closure.
    if(variable->isTemporal())
    {
        auto temporal = std::static_pointer_cast<TemporalVariableLookup> (variable);
        if(temporal->getLocalContext() != localContext)
            temporal->setCapturedInClosure(true);
    }

    node->setVariable(variable);

    return Oop();
}